

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void __thiscall Catch::Config::~Config(Config *this)

{
  Config *in_RDI;
  
  ~Config(in_RDI);
  operator_delete(in_RDI,0x158);
  return;
}

Assistant:

virtual ~Config() = default;